

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_NodeShowBdd(Abc_Obj_t *pNode)

{
  char *pName;
  FILE *__stream;
  Vec_Ptr_t *vNames;
  char *pNameOut;
  char FileNameDot [200];
  
  if ((pNode->pNtk->ntkFunc == ABC_FUNC_BDD) && (pNode->pNtk->ntkType == ABC_NTK_LOGIC)) {
    pName = Abc_ObjName(pNode);
    Abc_ShowGetFileName(pName,FileNameDot);
    __stream = fopen(FileNameDot,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
    }
    else {
      vNames = Abc_NodeGetFaninNames(pNode);
      pNameOut = Abc_ObjName(pNode);
      Cudd_DumpDot((DdManager *)pNode->pNtk->pManFunc,1,(DdNode **)&(pNode->field_5).pData,
                   (char **)vNames->pArray,&pNameOut,(FILE *)__stream);
      Abc_NodeFreeNames(vNames);
      Abc_NtkCleanCopy(pNode->pNtk);
      fclose(__stream);
      Abc_ShowFile(FileNameDot);
    }
    return;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcShow.c"
                ,0x5f,"void Abc_NodeShowBdd(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeShowBdd( Abc_Obj_t * pNode )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn;
    char FileNameDot[200];
    char * pNameOut;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    vNamesIn = Abc_NodeGetFaninNames( pNode );
    pNameOut = Abc_ObjName(pNode);
    Cudd_DumpDot( (DdManager *)pNode->pNtk->pManFunc, 1, (DdNode **)&pNode->pData, (char **)vNamesIn->pArray, &pNameOut, pFile );
    Abc_NodeFreeNames( vNamesIn );
    Abc_NtkCleanCopy( pNode->pNtk );
    fclose( pFile );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}